

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int cuddWindowReorder(DdManager *table,int low,int high,Cudd_ReorderingType submethod)

{
  int local_28;
  int res;
  Cudd_ReorderingType submethod_local;
  int high_local;
  int low_local;
  DdManager *table_local;
  
  switch(submethod) {
  case CUDD_REORDER_WINDOW2:
    local_28 = ddWindow2(table,low,high);
    break;
  case CUDD_REORDER_WINDOW3:
    local_28 = ddWindow3(table,low,high);
    break;
  case CUDD_REORDER_WINDOW4:
    local_28 = ddWindow4(table,low,high);
    break;
  case CUDD_REORDER_WINDOW2_CONV:
    local_28 = ddWindowConv2(table,low,high);
    break;
  case CUDD_REORDER_WINDOW3_CONV:
    local_28 = ddWindowConv3(table,low,high);
    break;
  case CUDD_REORDER_WINDOW4_CONV:
    local_28 = ddWindowConv4(table,low,high);
    break;
  default:
    return 0;
  }
  return local_28;
}

Assistant:

int
cuddWindowReorder(
  DdManager * table /* DD table */,
  int low /* lowest index to reorder */,
  int high /* highest index to reorder */,
  Cudd_ReorderingType submethod /* window reordering option */)
{

    int res;
#ifdef DD_DEBUG
    int supposedOpt;
#endif

    switch (submethod) {
    case CUDD_REORDER_WINDOW2:
        res = ddWindow2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3:
        res = ddWindow3(table,low,high);
        break;
    case CUDD_REORDER_WINDOW4:
        res = ddWindow4(table,low,high);
        break;
    case CUDD_REORDER_WINDOW2_CONV:
        res = ddWindowConv2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3_CONV:
        res = ddWindowConv3(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow3(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err, "Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    case CUDD_REORDER_WINDOW4_CONV:
        res = ddWindowConv4(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow4(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err,"Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    default: return(0);
    }

    return(res);

}